

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O3

nghttp2_ssize
session_call_select_padding(nghttp2_session *session,nghttp2_frame *frame,size_t max_payloadlen)

{
  nghttp2_select_padding_callback2 p_Var1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (frame->hd).length;
  if ((uVar3 < max_payloadlen) &&
     ((p_Var1 = (session->callbacks).select_padding_callback2,
      p_Var1 != (nghttp2_select_padding_callback2)0x0 ||
      (p_Var1 = (nghttp2_select_padding_callback2)(session->callbacks).select_padding_callback,
      p_Var1 != (nghttp2_select_padding_callback2)0x0)))) {
    uVar4 = uVar3 + 0x100;
    if (max_payloadlen <= uVar3 + 0x100) {
      uVar4 = max_payloadlen;
    }
    uVar2 = (*p_Var1)(session,frame,uVar4,session->user_data);
    uVar3 = uVar2;
    if ((long)uVar2 < (long)(frame->hd).length) {
      uVar3 = 0xfffffffffffffc7a;
    }
    if ((long)uVar4 < (long)uVar2) {
      uVar3 = 0xfffffffffffffc7a;
    }
  }
  return uVar3;
}

Assistant:

static nghttp2_ssize session_call_select_padding(nghttp2_session *session,
                                                 const nghttp2_frame *frame,
                                                 size_t max_payloadlen) {
  nghttp2_ssize rv;
  size_t max_paddedlen;

  if (frame->hd.length >= max_payloadlen ||
      (!session->callbacks.select_padding_callback2 &&
       !session->callbacks.select_padding_callback)) {
    return (nghttp2_ssize)frame->hd.length;
  }

  max_paddedlen =
    nghttp2_min_size(frame->hd.length + NGHTTP2_MAX_PADLEN, max_payloadlen);

  if (session->callbacks.select_padding_callback2) {
    rv = session->callbacks.select_padding_callback2(
      session, frame, max_paddedlen, session->user_data);
  } else {
    rv = (nghttp2_ssize)session->callbacks.select_padding_callback(
      session, frame, max_paddedlen, session->user_data);
  }
  if (rv < (nghttp2_ssize)frame->hd.length ||
      rv > (nghttp2_ssize)max_paddedlen) {
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }
  return rv;
}